

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

int XMLNode_move_child(XMLNode *node,int from,int to)

{
  uint uVar1;
  _XMLNode *p_Var2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar3 = 0;
  if ((((node != (XMLNode *)0x0) && (-1 < from)) && (node->init_value == 0x19770522)) &&
     (uVar1 = node->n_children, from < (int)uVar1)) {
    uVar4 = 0;
    if (0 < to) {
      uVar4 = to;
    }
    uVar5 = uVar1 - 1;
    if (uVar4 < uVar1) {
      uVar5 = uVar4;
    }
    uVar7 = (ulong)(uint)from;
    p_Var2 = node->children[uVar7];
    if ((uint)from < uVar5) {
      for (; from < (int)uVar5; from = from + 1) {
        node->children[uVar7] = node->children[uVar7 + 1];
        uVar7 = uVar7 + 1;
      }
      uVar6 = (ulong)(int)uVar5;
    }
    else {
      uVar6 = (ulong)uVar5;
      for (; (long)uVar6 < (long)uVar7; uVar7 = uVar7 - 1) {
        node->children[uVar7] = node->children[uVar7 - 1];
      }
    }
    node->children[uVar6] = p_Var2;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int XMLNode_move_child(XMLNode* node, int from, int to)
{
	XMLNode* nfrom;

	CHECK_NODE(node, FALSE);
	if (from < 0 || from >= node->n_children)
		return FALSE;
	if (to < 0) /* Before first => first */
		to = 0;
	if (to >= node->n_children) /* After last => last */
		to = node->n_children - 1;

	nfrom = node->children[from];
	if (to > from) { /* Move forward: bring following nodes (up to 'to') backward one position */
		int i;
		for (i = from; i < to; i++)
			node->children[i] = node->children[i+1];
	} else { /* Move backward: bring previous nodes (up to 'from') forward one position */
		int i;
		for (i = from - 1; i >= to; i--)
			node->children[i+1] = node->children[i];
	}
	node->children[to] = nfrom;

	return TRUE;
}